

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void dcbz_common(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t opcode,_Bool epid,
                uintptr_t retaddr)

{
  ulong uVar1;
  ulong addr_00;
  void *__s;
  int local_50;
  int mmu_idx;
  void *haddr;
  size_t sStack_38;
  uint32_t i;
  target_ulong dcbz_size;
  target_ulong mask;
  uintptr_t retaddr_local;
  _Bool epid_local;
  uint32_t opcode_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  sStack_38 = (size_t)env->dcache_line_size;
  if (epid) {
    local_50 = 9;
  }
  else {
    local_50 = env->dmmu_idx;
  }
  if (((env->excp_model == POWERPC_EXCP_970) && ((opcode & 0x200000) == 0)) &&
     ((env->spr[0x3f6] >> 7 & 3) == 1)) {
    sStack_38 = 0x20;
  }
  uVar1 = sStack_38 - 1 ^ 0xffffffffffffffff;
  addr_00 = uVar1 & addr;
  if ((env->reserve_addr & uVar1) == addr_00) {
    env->reserve_addr = 0xffffffffffffffff;
  }
  __s = probe_write(env,addr_00,(int)sStack_38,local_50,retaddr);
  if (__s == (void *)0x0) {
    for (haddr._4_4_ = 0; haddr._4_4_ < sStack_38; haddr._4_4_ = haddr._4_4_ + 8) {
      cpu_stq_mmuidx_ra_ppc64(env,addr_00 + haddr._4_4_,0,local_50,retaddr);
    }
  }
  else {
    memset(__s,0,sStack_38);
  }
  return;
}

Assistant:

static void dcbz_common(CPUPPCState *env, target_ulong addr,
                        uint32_t opcode, bool epid, uintptr_t retaddr)
{
    target_ulong mask, dcbz_size = env->dcache_line_size;
    uint32_t i;
    void *haddr;
    int mmu_idx = epid ? PPC_TLB_EPID_STORE : env->dmmu_idx;

#if defined(TARGET_PPC64)
    /* Check for dcbz vs dcbzl on 970 */
    if (env->excp_model == POWERPC_EXCP_970 &&
        !(opcode & 0x00200000) && ((env->spr[SPR_970_HID5] >> 7) & 0x3) == 1) {
        dcbz_size = 32;
    }
#endif

    /* Align address */
    mask = ~(dcbz_size - 1);
    addr &= mask;

    /* Check reservation */
    if ((env->reserve_addr & mask) == addr)  {
#ifdef _MSC_VER
        env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
        env->reserve_addr = (target_ulong)-1ULL;
#endif
    }

    /* Try fast path translate */
    haddr = probe_write(env, addr, dcbz_size, mmu_idx, retaddr);
    if (haddr) {
        memset(haddr, 0, dcbz_size);
    } else {
        /* Slow path */
        for (i = 0; i < dcbz_size; i += 8) {
            cpu_stq_mmuidx_ra(env, addr + i, 0, mmu_idx, retaddr);
        }
    }
}